

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O3

void config_value_destroy(config_value *value)

{
  data_types dVar1;
  
  dVar1 = value->type;
  if (dVar1 == STRING) {
    free((value->data).string);
    dVar1 = value->type;
  }
  if ((dVar1 == ARRAY) && ((value->data).array != (config_array *)0x0)) {
    config_array_destroy((value->data).array);
  }
  free(value);
  return;
}

Assistant:

void config_value_destroy(struct config_value *value)
{
        if (value->type == STRING) {
                // For strings we need to free the data as well
                free(value->data.string);
        }

        if (value->type == ARRAY && value->data.array != NULL) {
                config_array_destroy(value->data.array);
        }

        free(value);
}